

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O1

QString * __thiscall
ResourceLeafWrapper::getFieldName
          (QString *__return_storage_ptr__,ResourceLeafWrapper *this,size_t fieldId)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  switch(fieldId) {
  case 0:
    psVar1 = (storage_type *)0xc;
    goto LAB_0013925c;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  default:
    QVar3.m_data = (storage_type *)0x0;
    QVar3.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar3);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    goto LAB_00139279;
  }
  psVar1 = (storage_type *)0x8;
LAB_0013925c:
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_30;
LAB_00139279:
  (__return_storage_ptr__->d).ptr = local_28;
  (__return_storage_ptr__->d).size = local_20;
  return __return_storage_ptr__;
}

Assistant:

QString ResourceLeafWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case OFFSET_TO_DATA: return "OffsetToData";
        case DATA_SIZE: return "DataSize";
        case CODE_PAGE: return "CodePage";
        case RESERVED: return "Reserved";
    }
    return "";
}